

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  long y_00;
  long y_01;
  long x_00;
  long lVar1;
  ssize_t x_01;
  bool bVar2;
  uint64_t _a;
  uint64_t _b;
  uint64_t _g;
  uint64_t _r;
  ssize_t local_a8;
  ssize_t local_a0;
  ssize_t local_98;
  ssize_t local_90;
  ssize_t local_88;
  ssize_t local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  ssize_t local_38;
  
  local_a0 = w;
  if (w < 0) {
    local_a0 = source->width;
  }
  local_a8 = h;
  if (h < 0) {
    local_a8 = source->height;
  }
  local_98 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_98,&local_a0,&local_a8,&sx,&sy);
  local_78 = sx;
  local_80 = sy;
  local_88 = local_38;
  local_60 = 0;
  local_70 = local_a0;
  if (local_a0 < 1) {
    local_70 = local_60;
  }
  local_90 = local_98;
  local_68 = local_a8;
  if (local_a8 < 1) {
    local_68 = local_60;
  }
  for (; local_60 != local_68; local_60 = local_60 + 1) {
    y_00 = local_80 + local_60;
    y_01 = local_90 + local_60;
    x_00 = local_78;
    lVar1 = local_70;
    x_01 = local_88;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      read_pixel(source,x_00,y_00,&local_40,&local_48,&local_50,&local_58);
      if (local_50 != b || (local_48 != g || local_40 != r)) {
        write_pixel(this,x_01,y_01,local_40,local_48,local_50,local_58);
      }
      x_00 = x_00 + 1;
      x_01 = x_01 + 1;
    }
  }
  return;
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
      if (r != _r || g != _g || b != _b) {
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}